

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cpp
# Opt level: O3

void __thiscall
stackjit::FunctionDefinition::FunctionDefinition
          (FunctionDefinition *this,string *name,
          vector<const_stackjit::Type_*,_std::allocator<const_stackjit::Type_*>_> *parameters,
          Type *returnType,BytePtr entryPoint,ClassType *classType,AccessModifier accessModifier,
          bool isConstructor)

{
  vector<const_stackjit::Type_*,_std::allocator<const_stackjit::Type_*>_> *this_00;
  pointer pcVar1;
  string *psVar2;
  long *plVar3;
  ClassType *pCVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  ClassType *local_50;
  long local_48;
  _func_int **local_40;
  _Alloc_hider _Stack_38;
  
  (this->mName)._M_dataplus._M_p = (pointer)&(this->mName).field_2;
  pcVar1 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)this,pcVar1,pcVar1 + name->_M_string_length);
  this_00 = &this->mParameters;
  std::vector<const_stackjit::Type_*,_std::allocator<const_stackjit::Type_*>_>::vector
            (this_00,parameters);
  (this->mCallParameters).
  super__Vector_base<const_stackjit::Type_*,_std::allocator<const_stackjit::Type_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mCallParameters).
  super__Vector_base<const_stackjit::Type_*,_std::allocator<const_stackjit::Type_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mCallParameters).
  super__Vector_base<const_stackjit::Type_*,_std::allocator<const_stackjit::Type_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->mReturnType = returnType;
  this->mEntryPoint = entryPoint;
  this->mIsManaged = false;
  this->mIsMemberFunction = classType != (ClassType *)0x0;
  this->mClassType = classType;
  (this->mMemberName)._M_dataplus._M_p = (pointer)&(this->mMemberName).field_2;
  (this->mMemberName)._M_string_length = 0;
  (this->mMemberName).field_2._M_local_buf[0] = '\0';
  this->mAccessModifier = accessModifier;
  this->mIsConstructor = isConstructor;
  this->mIsVirtual = false;
  std::vector<const_stackjit::Type_*,_std::allocator<const_stackjit::Type_*>_>::operator=
            (&this->mCallParameters,this_00);
  if (this->mIsMemberFunction == true) {
    local_50 = this->mClassType;
    std::vector<const_stackjit::Type_*,_std::allocator<const_stackjit::Type_*>_>::_M_insert_rval
              (this_00,(const_iterator)
                       (this->mParameters).
                       super__Vector_base<const_stackjit::Type_*,_std::allocator<const_stackjit::Type_*>_>
                       ._M_impl.super__Vector_impl_data._M_start,(value_type *)&local_50);
    std::__cxx11::string::_M_assign((string *)&this->mMemberName);
    psVar2 = ClassType::className_abi_cxx11_(classType);
    pcVar1 = (psVar2->_M_dataplus)._M_p;
    local_70[0] = local_60;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_70,pcVar1,pcVar1 + psVar2->_M_string_length);
    std::__cxx11::string::append((char *)local_70);
    plVar3 = (long *)std::__cxx11::string::_M_append
                               ((char *)local_70,(ulong)(this->mName)._M_dataplus._M_p);
    pCVar4 = (ClassType *)(plVar3 + 2);
    if ((ClassType *)*plVar3 == pCVar4) {
      local_40 = (pCVar4->super_ReferenceType).super_Type._vptr_Type;
      _Stack_38._M_p = (pointer)plVar3[3];
      local_50 = (ClassType *)&stack0xffffffffffffffc0;
    }
    else {
      local_40 = (pCVar4->super_ReferenceType).super_Type._vptr_Type;
      local_50 = (ClassType *)*plVar3;
    }
    local_48 = plVar3[1];
    *plVar3 = (long)pCVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    std::__cxx11::string::operator=((string *)this,(string *)&local_50);
    if (local_50 != (ClassType *)&stack0xffffffffffffffc0) {
      operator_delete(local_50);
    }
    if (local_70[0] != local_60) {
      operator_delete(local_70[0]);
    }
  }
  return;
}

Assistant:

FunctionDefinition::FunctionDefinition(
		std::string name,
		std::vector<const Type*> parameters,
		const Type* returnType,
		BytePtr entryPoint,
		const ClassType* classType,
		AccessModifier accessModifier,
		bool isConstructor)
	    : mName(name),
	      mParameters(parameters),
	      mReturnType(returnType),
	      mEntryPoint(entryPoint),
	      mIsManaged(false),
		  mIsMemberFunction(classType != nullptr),
		  mClassType(classType),
		  mAccessModifier(accessModifier),
		  mIsConstructor(isConstructor),
		  mIsVirtual(false) {
		mCallParameters = mParameters;
		if (mIsMemberFunction) {
			mParameters.insert(mParameters.begin(), mClassType);
			mMemberName = mName;
			mName = classType->className() + "::" + mName;
		}
	}